

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

int __thiscall QComboBoxPrivate::init(QComboBoxPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *this_00;
  int extraout_EAX;
  QStandardItemModel *this_01;
  
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  QWidget::setFocusPolicy(this_00,WheelFocus);
  QWidget::setSizePolicy(this_00,(QSizePolicy)0x3050000);
  QWidgetPrivate::setLayoutItemMargins
            (&this->super_QWidgetPrivate,SE_ComboBoxLayoutItem,(QStyleOption *)0x0);
  this_01 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this_01,0,1,&this_00->super_QObject);
  (**(code **)(*(long *)this_00 + 0x1a0))(this_00,this_01);
  QWidget::setAttribute
            (this_00,WA_InputMethodEnabled,*(long *)(*(long *)&this_00->field_0x8 + 0x2a0) != 0);
  return extraout_EAX;
}

Assistant:

void QComboBoxPrivate::init()
{
    Q_Q(QComboBox);
#ifdef Q_OS_MACOS
    // On OS X, only line edits and list views always get tab focus. It's only
    // when we enable full keyboard access that other controls can get tab focus.
    // When it's not editable, a combobox looks like a button, and it behaves as
    // such in this respect.
    if (!q->isEditable())
        q->setFocusPolicy(Qt::TabFocus);
    else
#endif
        q->setFocusPolicy(Qt::WheelFocus);

    q->setSizePolicy(QSizePolicy(QSizePolicy::Preferred, QSizePolicy::Fixed,
                                 QSizePolicy::ComboBox));
    setLayoutItemMargins(QStyle::SE_ComboBoxLayoutItem);
    q->setModel(new QStandardItemModel(0, 1, q));
    if (!q->isEditable())
        q->setAttribute(Qt::WA_InputMethodEnabled, false);
    else
        q->setAttribute(Qt::WA_InputMethodEnabled);
}